

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_3(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  shared_ptr<Pl_StdioFile> out;
  QPDFObjectHandle stream;
  QPDFObjectHandle streams;
  undefined1 local_71;
  Pl_StdioFile *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50 [2];
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  QPDF::getTrailer();
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/QStreams","");
  QPDFObjectHandle::getKey(local_40);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  iVar3 = 0;
  while( true ) {
    iVar1 = QPDFObjectHandle::getArrayNItems();
    if (iVar1 <= iVar3) break;
    QPDFObjectHandle::getArrayItem((int)(Pipeline *)&local_60);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- stream ",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," --",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
    QUtil::binary_stdout();
    local_70 = (Pl_StdioFile *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_StdioFile,std::allocator<Pl_StdioFile>,char_const(&)[17],_IO_FILE*&>
              (&local_68,&local_70,(allocator<Pl_StdioFile> *)&local_71,
               (char (*) [17])"tokenized stream",(_IO_FILE **)&stdout);
    QPDFObjectHandle::pipeStreamData
              ((Pipeline *)&local_60,(int)local_70,qpdf_dl_specialized,true,false);
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    iVar3 = iVar3 + 1;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

static void
test_3(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle streams = pdf.getTrailer().getKey("/QStreams");
    for (int i = 0; i < streams.getArrayNItems(); ++i) {
        QPDFObjectHandle stream = streams.getArrayItem(i);
        std::cout << "-- stream " << i << " --" << std::endl;
        std::cout.flush();
        QUtil::binary_stdout();
        auto out = std::make_shared<Pl_StdioFile>("tokenized stream", stdout);
        stream.pipeStreamData(out.get(), qpdf_ef_normalize, qpdf_dl_generalized);
    }
}